

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O0

POLICYQUALINFO * notice_section(X509V3_CTX *ctx,stack_st_CONF_VALUE *unot,int ia5org)

{
  ASN1_STRING *pAVar1;
  char *pcVar2;
  int iVar3;
  POLICYQUALINFO *a;
  ASN1_OBJECT *pAVar4;
  USERNOTICE *pUVar5;
  CONF_VALUE *pCVar6;
  ASN1_VISIBLESTRING *pAVar7;
  size_t sVar8;
  stack_st_CONF_VALUE *sk;
  size_t sVar9;
  int ret;
  stack_st_CONF_VALUE *nos;
  NOTICEREF *nref_1;
  NOTICEREF *nref;
  CONF_VALUE *cnf;
  size_t i;
  POLICYQUALINFO *qual;
  USERNOTICE *notice;
  int ia5org_local;
  stack_st_CONF_VALUE *unot_local;
  X509V3_CTX *ctx_local;
  
  a = POLICYQUALINFO_new();
  if (a != (POLICYQUALINFO *)0x0) {
    pAVar4 = OBJ_nid2obj(0xa5);
    a->pqualid = pAVar4;
    if (a->pqualid == (ASN1_OBJECT *)0x0) {
      ERR_put_error(0x14,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                    ,0x112);
    }
    else {
      pUVar5 = USERNOTICE_new();
      if (pUVar5 != (USERNOTICE *)0x0) {
        (a->d).usernotice = pUVar5;
        for (cnf = (CONF_VALUE *)0x0; pCVar6 = (CONF_VALUE *)sk_CONF_VALUE_num(unot), cnf < pCVar6;
            cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
          pCVar6 = sk_CONF_VALUE_value(unot,(size_t)cnf);
          iVar3 = strcmp(pCVar6->name,"explicitText");
          if (iVar3 == 0) {
            pAVar7 = ASN1_VISIBLESTRING_new();
            pUVar5->exptext = pAVar7;
            if (pUVar5->exptext == (ASN1_STRING *)0x0) goto LAB_003153ce;
            pAVar1 = (ASN1_STRING *)pUVar5->exptext;
            pcVar2 = pCVar6->value;
            sVar8 = strlen(pCVar6->value);
            iVar3 = ASN1_STRING_set(pAVar1,pcVar2,sVar8);
          }
          else {
            iVar3 = strcmp(pCVar6->name,"organization");
            if (iVar3 == 0) {
              if (pUVar5->noticeref == (NOTICEREF *)0x0) {
                nref_1 = (NOTICEREF *)NOTICEREF_new();
                if (nref_1 == (NOTICEREF *)0x0) goto LAB_003153ce;
                pUVar5->noticeref = (NOTICEREF *)nref_1;
              }
              else {
                nref_1 = (NOTICEREF *)pUVar5->noticeref;
              }
              if (ia5org == 0) {
                nref_1->organization->type = 0x1a;
              }
              else {
                nref_1->organization->type = 0x16;
              }
              pAVar1 = nref_1->organization;
              pcVar2 = pCVar6->value;
              sVar8 = strlen(pCVar6->value);
              iVar3 = ASN1_STRING_set(pAVar1,pcVar2,sVar8);
            }
            else {
              iVar3 = strcmp(pCVar6->name,"noticeNumbers");
              if (iVar3 != 0) {
                ERR_put_error(0x14,0,0x82,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                              ,0x14e);
                ERR_add_error_data(6,"section:",pCVar6->section,",name:",pCVar6->name,",value:",
                                   pCVar6->value);
                goto LAB_003153ce;
              }
              if (pUVar5->noticeref == (NOTICEREF *)0x0) {
                nos = (stack_st_CONF_VALUE *)NOTICEREF_new();
                if ((NOTICEREF *)nos == (NOTICEREF *)0x0) goto LAB_003153ce;
                pUVar5->noticeref = (NOTICEREF *)nos;
              }
              else {
                nos = (stack_st_CONF_VALUE *)pUVar5->noticeref;
              }
              sk = (stack_st_CONF_VALUE *)X509V3_parse_list(pCVar6->value);
              if ((sk == (stack_st_CONF_VALUE *)0x0) || (sVar9 = sk_CONF_VALUE_num(sk), sVar9 == 0))
              {
                ERR_put_error(0x14,0,0x80,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                              ,0x143);
                ERR_add_error_data(6,"section:",pCVar6->section,",name:",pCVar6->name,",value:",
                                   pCVar6->value);
                sk_CONF_VALUE_pop_free(sk,X509V3_conf_free);
                goto LAB_003153ce;
              }
              iVar3 = nref_nos(*(stack_st_ASN1_INTEGER **)(nos + 8),sk);
              sk_CONF_VALUE_pop_free(sk,X509V3_conf_free);
            }
          }
          if (iVar3 == 0) goto LAB_003153ce;
        }
        if (pUVar5->noticeref == (NOTICEREF *)0x0) {
          return (POLICYQUALINFO *)a;
        }
        if ((pUVar5->noticeref->noticenos != (stack_st_ASN1_INTEGER *)0x0) &&
           (pUVar5->noticeref->organization != (ASN1_STRING *)0x0)) {
          return (POLICYQUALINFO *)a;
        }
        ERR_put_error(0x14,0,0x8a,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_cpols.cc"
                      ,0x156);
      }
    }
  }
LAB_003153ce:
  POLICYQUALINFO_free(a);
  return (POLICYQUALINFO *)0x0;
}

Assistant:

static POLICYQUALINFO *notice_section(const X509V3_CTX *ctx,
                                      const STACK_OF(CONF_VALUE) *unot,
                                      int ia5org) {
  USERNOTICE *notice;
  POLICYQUALINFO *qual;
  if (!(qual = POLICYQUALINFO_new())) {
    goto err;
  }
  qual->pqualid = OBJ_nid2obj(NID_id_qt_unotice);
  if (qual->pqualid == NULL) {
    OPENSSL_PUT_ERROR(X509V3, ERR_R_INTERNAL_ERROR);
    goto err;
  }
  if (!(notice = USERNOTICE_new())) {
    goto err;
  }
  qual->d.usernotice = notice;
  for (size_t i = 0; i < sk_CONF_VALUE_num(unot); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(unot, i);
    if (!strcmp(cnf->name, "explicitText")) {
      notice->exptext = ASN1_VISIBLESTRING_new();
      if (notice->exptext == NULL) {
        goto err;
      }
      if (!ASN1_STRING_set(notice->exptext, cnf->value, strlen(cnf->value))) {
        goto err;
      }
    } else if (!strcmp(cnf->name, "organization")) {
      NOTICEREF *nref;
      if (!notice->noticeref) {
        if (!(nref = NOTICEREF_new())) {
          goto err;
        }
        notice->noticeref = nref;
      } else {
        nref = notice->noticeref;
      }
      if (ia5org) {
        nref->organization->type = V_ASN1_IA5STRING;
      } else {
        nref->organization->type = V_ASN1_VISIBLESTRING;
      }
      if (!ASN1_STRING_set(nref->organization, cnf->value,
                           strlen(cnf->value))) {
        goto err;
      }
    } else if (!strcmp(cnf->name, "noticeNumbers")) {
      NOTICEREF *nref;
      STACK_OF(CONF_VALUE) *nos;
      if (!notice->noticeref) {
        if (!(nref = NOTICEREF_new())) {
          goto err;
        }
        notice->noticeref = nref;
      } else {
        nref = notice->noticeref;
      }
      nos = X509V3_parse_list(cnf->value);
      if (!nos || !sk_CONF_VALUE_num(nos)) {
        OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NUMBERS);
        X509V3_conf_err(cnf);
        sk_CONF_VALUE_pop_free(nos, X509V3_conf_free);
        goto err;
      }
      int ret = nref_nos(nref->noticenos, nos);
      sk_CONF_VALUE_pop_free(nos, X509V3_conf_free);
      if (!ret) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OPTION);
      X509V3_conf_err(cnf);
      goto err;
    }
  }

  if (notice->noticeref &&
      (!notice->noticeref->noticenos || !notice->noticeref->organization)) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NEED_ORGANIZATION_AND_NUMBERS);
    goto err;
  }

  return qual;

err:
  POLICYQUALINFO_free(qual);
  return NULL;
}